

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O0

void qSendWindowChangeToTextureChildrenRecursively(QWidget *widget,Type eventType)

{
  bool bVar1;
  QWidgetPrivate *pQVar2;
  QWidget *this;
  qsizetype qVar3;
  QWidget *pQVar4;
  QWindow *pQVar5;
  Type in_ESI;
  QObject *in_RDI;
  long in_FS_OFFSET;
  QWindow *window;
  QWidget *w;
  int i;
  QWidgetPrivate *d;
  QEvent e_1;
  QEvent e;
  QObject *in_stack_ffffffffffffff98;
  int local_44;
  undefined4 in_stack_ffffffffffffffc8;
  undefined1 *local_28;
  undefined1 *local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = QWidgetPrivate::get((QWidget *)0x37e339);
  if ((*(uint *)&pQVar2->field_0x250 >> 0x18 & 1) != 0) {
    local_18 = &DAT_aaaaaaaaaaaaaaaa;
    local_10 = &DAT_aaaaaaaaaaaaaaaa;
    QEvent::QEvent((QEvent *)&local_18,in_ESI);
    QCoreApplication::sendEvent(in_RDI,(QEvent *)&local_18);
    QEvent::~QEvent((QEvent *)&local_18);
  }
  local_44 = 0;
  while( true ) {
    this = (QWidget *)(long)local_44;
    qVar3 = QList<QObject_*>::size((QList<QObject_*> *)&pQVar2->field_0x18);
    if (qVar3 <= (long)this) break;
    QList<QObject_*>::at((QList<QObject_*> *)this,(qsizetype)in_stack_ffffffffffffff98);
    pQVar4 = qobject_cast<QWidget*>(in_stack_ffffffffffffff98);
    if (pQVar4 != (QWidget *)0x0) {
      bVar1 = QWidget::isWindow(this);
      if (!bVar1) {
        qSendWindowChangeToTextureChildrenRecursively
                  ((QWidget *)CONCAT44(in_ESI,in_stack_ffffffffffffffc8),
                   (Type)((ulong)pQVar2 >> 0x20));
      }
    }
    local_44 = local_44 + 1;
  }
  pQVar5 = QWidgetPrivate::windowHandle
                     ((QWidgetPrivate *)CONCAT44(in_ESI,in_stack_ffffffffffffffc8),
                      (WindowHandleMode)((ulong)pQVar2 >> 0x20));
  if (pQVar5 != (QWindow *)0x0) {
    local_28 = &DAT_aaaaaaaaaaaaaaaa;
    local_20 = &DAT_aaaaaaaaaaaaaaaa;
    QEvent::QEvent((QEvent *)&local_28,in_ESI);
    QCoreApplication::sendEvent((QObject *)pQVar5,(QEvent *)&local_28);
    QEvent::~QEvent((QEvent *)&local_28);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void qSendWindowChangeToTextureChildrenRecursively(QWidget *widget, QEvent::Type eventType)
{
    QWidgetPrivate *d = QWidgetPrivate::get(widget);
    if (d->renderToTexture) {
        QEvent e(eventType);
        QCoreApplication::sendEvent(widget, &e);
    }

    for (int i = 0; i < d->children.size(); ++i) {
        QWidget *w = qobject_cast<QWidget *>(d->children.at(i));
        if (w && !w->isWindow())
            qSendWindowChangeToTextureChildrenRecursively(w, eventType);
    }

    // Notify QWidgetWindow after we've notified all child QWidgets
    if (auto *window = d->windowHandle(QWidgetPrivate::WindowHandleMode::Direct)) {
        QEvent e(eventType);
        QCoreApplication::sendEvent(window, &e);
    }
}